

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected.hpp
# Opt level: O2

void __thiscall
nonstd::expected_lite::
expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~expected(expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this)

{
  if ((this->contained).
      super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value == true) {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this);
    return;
  }
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

~expected()
    {
        if ( has_value() ) contained.destruct_value();
        else               contained.destruct_error();
    }